

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64 drwav_read_s32__mulaw(drwav *pWav,drwav_uint64 samplesToRead,drwav_int32 *pBufferOut)

{
  drwav_uint32 dVar1;
  drwav_int32 *in_RDX;
  long in_RSI;
  drwav *in_RDI;
  drwav_uint64 samplesRead;
  uchar sampleData [4096];
  drwav_uint64 totalSamplesRead;
  drwav_uint32 bytesPerSample;
  void *in_stack_ffffffffffffefc0;
  drwav_uint64 in_stack_ffffffffffffefc8;
  drwav *in_stack_ffffffffffffefd0;
  drwav_uint64 local_30;
  drwav_int32 *local_20;
  long local_18;
  drwav_uint64 local_8;
  
  dVar1 = drwav_get_bytes_per_sample(in_RDI);
  if (dVar1 == 0) {
    local_8 = 0;
  }
  else {
    local_30 = 0;
    local_20 = in_RDX;
    local_18 = in_RSI;
    while ((local_18 != 0 &&
           (in_stack_ffffffffffffefc0 =
                 (void *)drwav_read(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                                    in_stack_ffffffffffffefc0),
           in_stack_ffffffffffffefc0 != (void *)0x0))) {
      drwav_mulaw_to_s32(local_20,&stack0xffffffffffffefc8,(size_t)in_stack_ffffffffffffefc0);
      local_20 = local_20 + (long)in_stack_ffffffffffffefc0;
      local_18 = local_18 - (long)in_stack_ffffffffffffefc0;
      local_30 = (long)in_stack_ffffffffffffefc0 + local_30;
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

drwav_uint64 drwav_read_s32__mulaw(drwav* pWav, drwav_uint64 samplesToRead, drwav_int32* pBufferOut)
{
    drwav_uint32 bytesPerSample = drwav_get_bytes_per_sample(pWav);
    if (bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead = drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData)/bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav_mulaw_to_s32(pBufferOut, sampleData, (size_t)samplesRead);

        pBufferOut       += samplesRead;
        samplesToRead    -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}